

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KangarooTwelve.c
# Opt level: O0

int KangarooTwelve_Final
              (KangarooTwelve_Instance *ktInstance,uchar *output,uchar *customization,
              size_t customLen)

{
  int iVar1;
  uint uVar2;
  size_t in_RCX;
  KeccakWidth1600_12rounds_SpongeInstance *in_RDI;
  uchar intermediate [32];
  uint n;
  uchar padding;
  uchar encbuf [11];
  KeccakWidth1600_12rounds_SpongeInstance *instance;
  size_t in_stack_ffffffffffffffb0;
  uchar *in_stack_ffffffffffffffb8;
  KeccakWidth1600_12rounds_SpongeInstance *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int local_4;
  
  if (*(int *)(in_RDI[2].state + 0x1c) == 1) {
    if ((in_RCX == 0) ||
       (iVar1 = KangarooTwelve_Update
                          ((KangarooTwelve_Instance *)intermediate._24_8_,
                           (uchar *)intermediate._16_8_,intermediate._8_8_), iVar1 == 0)) {
      instance = in_RDI;
      right_encode(&stack0xffffffffffffffcd,in_RCX);
      iVar1 = KangarooTwelve_Update
                        ((KangarooTwelve_Instance *)intermediate._24_8_,(uchar *)intermediate._16_8_
                         ,intermediate._8_8_);
      if (iVar1 == 0) {
        if (*(long *)(in_RDI[2].state + 0x10) != 0) {
          if (*(int *)(in_RDI[2].state + 0x18) != 0) {
            *(long *)(in_RDI[2].state + 0x10) = *(long *)(in_RDI[2].state + 0x10) + 1;
            iVar1 = KeccakWidth1600_12rounds_SpongeAbsorbLastFewBits(instance,'\0');
            if (iVar1 != 0) {
              return 1;
            }
            iVar1 = KeccakWidth1600_12rounds_SpongeSqueeze
                              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                               in_stack_ffffffffffffffb0);
            if (iVar1 != 0) {
              return 1;
            }
            iVar1 = KeccakWidth1600_12rounds_SpongeAbsorb
                              ((KeccakWidth1600_12rounds_SpongeInstance *)
                               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                               in_stack_ffffffffffffffc0->state,(size_t)in_stack_ffffffffffffffb8);
            if (iVar1 != 0) {
              return 1;
            }
          }
          *(long *)(in_RDI[2].state + 0x10) = *(long *)(in_RDI[2].state + 0x10) + -1;
          uVar2 = right_encode(&stack0xffffffffffffffcd,*(size_t *)(in_RDI[2].state + 0x10));
          (&stack0xffffffffffffffcd)[uVar2] = 0xff;
          (&stack0xffffffffffffffcd)[uVar2 + 1] = 0xff;
          iVar1 = KeccakWidth1600_12rounds_SpongeAbsorb
                            ((KeccakWidth1600_12rounds_SpongeInstance *)
                             CONCAT44(in_stack_ffffffffffffffcc,uVar2 + 2),
                             in_stack_ffffffffffffffc0->state,(size_t)in_stack_ffffffffffffffb8);
          if (iVar1 != 0) {
            return 1;
          }
        }
        iVar1 = KeccakWidth1600_12rounds_SpongeAbsorbLastFewBits(instance,'\0');
        if (iVar1 == 0) {
          if (*(long *)(in_RDI[2].state + 8) == 0) {
            in_RDI[2].state[0x1c] = '\x03';
            in_RDI[2].state[0x1d] = '\0';
            in_RDI[2].state[0x1e] = '\0';
            in_RDI[2].state[0x1f] = '\0';
            local_4 = 0;
          }
          else {
            in_RDI[2].state[0x1c] = '\x02';
            in_RDI[2].state[0x1d] = '\0';
            in_RDI[2].state[0x1e] = '\0';
            in_RDI[2].state[0x1f] = '\0';
            local_4 = KeccakWidth1600_12rounds_SpongeSqueeze
                                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                                 in_stack_ffffffffffffffb0);
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int KangarooTwelve_Final(KangarooTwelve_Instance *ktInstance, unsigned char * output, const unsigned char * customization, size_t customLen)
{
    unsigned char encbuf[sizeof(size_t)+1+2];
    unsigned char padding;

    if (ktInstance->phase != ABSORBING)
        return 1;

    /* Absorb customization | right_encode(customLen) */
    if ((customLen != 0) && (KangarooTwelve_Update(ktInstance, customization, customLen) != 0))
        return 1;
    if (KangarooTwelve_Update(ktInstance, encbuf, right_encode(encbuf, customLen)) != 0)
        return 1;

    if ( ktInstance->blockNumber == 0 ) {
        /* Non complete first block in final node, pad it */
        padding = 0x07; /*  '11': message hop, final node */
    }
    else {
        unsigned int n;

        if ( ktInstance->queueAbsorbedLen != 0 ) {
            /* There is data in the queue node */
            unsigned char intermediate[capacityInBytes];
            ++ktInstance->blockNumber;
            if (KeccakWidth1600_12rounds_SpongeAbsorbLastFewBits(&ktInstance->queueNode, suffixLeaf) != 0)
                return 1;
            if (KeccakWidth1600_12rounds_SpongeSqueeze(&ktInstance->queueNode, intermediate, capacityInBytes) != 0)
                return 1;
            if (KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->finalNode, intermediate, capacityInBytes) != 0)
                return 1;
        }
        --ktInstance->blockNumber; /* Absorb right_encode(number of Chaining Values) || 0xFF || 0xFF */
        n = right_encode(encbuf, ktInstance->blockNumber);
        encbuf[n++] = 0xFF;
        encbuf[n++] = 0xFF;
        if (KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->finalNode, encbuf, n) != 0)
            return 1;
        padding = 0x06; /* '01': chaining hop, final node */
    }
    if (KeccakWidth1600_12rounds_SpongeAbsorbLastFewBits(&ktInstance->finalNode, padding) != 0)
        return 1;
    if ( ktInstance->fixedOutputLength != 0 ) {
        ktInstance->phase = FINAL;
        return KeccakWidth1600_12rounds_SpongeSqueeze(&ktInstance->finalNode, output, ktInstance->fixedOutputLength);
    }
    ktInstance->phase = SQUEEZING;
    return 0;
}